

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::GetObjectSynchData
          (CSharedMemoryWaitableObject *this,VOID **ppvSynchData)

{
  VOID **ppvSynchData_local;
  CSharedMemoryWaitableObject *this_local;
  
  if (ppvSynchData == (VOID **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x5b0);
    fprintf(_stderr,"Expression: NULL != ppvSynchData\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  *ppvSynchData = this->m_pvSynchData;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return 0;
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::GetObjectSynchData(
    VOID **ppvSynchData             // OUT
    )
{
    _ASSERTE(NULL != ppvSynchData);
    
    ENTRY("CSharedMemoryWaitableObject::GetObjectSynchData"
        "(this = %p, ppvSynchData = %p)\n",
        this,
        ppvSynchData
        );
    
    *ppvSynchData = m_pvSynchData;

    LOGEXIT("CSharedMemoryWaitableObject::GetObjectSynchData returns %d\n",
        NO_ERROR
        );
    
    return NO_ERROR;
}